

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O1

int run_test_tcp_bind_or_listen_error_after_close(void)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t tcp;
  long local_100 [4];
  undefined1 local_e0 [216];
  
  local_100[2] = 0;
  local_100[1] = 0xf270002;
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,local_e0);
  local_100[0] = (long)iVar1;
  if (local_100[0] == 0) {
    uv_close(local_e0,0);
    iVar1 = uv_tcp_bind(local_e0,local_100 + 1,0);
    local_100[0] = (long)iVar1;
    if (local_100[0] != -0x16) goto LAB_001c7146;
    iVar1 = uv_listen(local_e0,5,0);
    local_100[0] = (long)iVar1;
    if (local_100[0] != -0x16) goto LAB_001c7153;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    local_100[0] = (long)iVar1;
    if (local_100[0] == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_100[0] = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (local_100[0] == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c716d;
    }
  }
  else {
    run_test_tcp_bind_or_listen_error_after_close_cold_1();
LAB_001c7146:
    run_test_tcp_bind_or_listen_error_after_close_cold_2();
LAB_001c7153:
    run_test_tcp_bind_or_listen_error_after_close_cold_3();
  }
  run_test_tcp_bind_or_listen_error_after_close_cold_4();
LAB_001c716d:
  plVar3 = local_100;
  run_test_tcp_bind_or_listen_error_after_close_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind_or_listen_error_after_close) {
  uv_tcp_t tcp;
  struct sockaddr_in addr;

  memset(&addr, 0, sizeof(addr));
  addr.sin_addr.s_addr = htonl(INADDR_ANY);
  addr.sin_port = htons(9999);
  addr.sin_family = AF_INET;

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &tcp));
  uv_close((uv_handle_t*) &tcp, NULL);
  ASSERT_EQ(uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0), UV_EINVAL);
  ASSERT_EQ(uv_listen((uv_stream_t*) &tcp, 5, NULL), UV_EINVAL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}